

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::ConvertMaterial(LWOImporter *this,Surface *surf,aiMaterial *pcMat)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 uVar1;
  undefined4 uVar2;
  ulong __n;
  bool bVar3;
  ai_real aVar4;
  Logger *pLVar5;
  _List_node_base *p_Var6;
  float *pInput;
  char *message;
  float fVar7;
  int i;
  aiColor3D local_5e0;
  float f;
  undefined4 uStack_5cc;
  int m_;
  ai_real aStack_5ac;
  ai_real local_5a8;
  aiString st;
  
  st.length = 0;
  st.data[0] = '\0';
  memset(st.data + 1,0x1b,0x3ff);
  __n = (surf->mName)._M_string_length;
  if (__n < 0x400) {
    st.length = (ai_uint32)__n;
    memcpy(st.data,(surf->mName)._M_dataplus._M_p,__n);
    st.data[__n] = '\0';
  }
  aiMaterial::AddProperty(pcMat,&st,"?mat.name",0,0);
  i = (int)surf->bDoubleSided;
  aiMaterial::AddProperty(pcMat,&i,1,"$mat.twosided",0,0);
  aiMaterial::AddProperty(pcMat,&surf->mIOR,1,"$mat.refracti",0,0);
  aiMaterial::AddProperty(pcMat,&surf->mBumpIntensity,1,"$mat.bumpscaling",0,0);
  aVar4 = 2.8026e-45;
  if ((surf->mSpecularValue != 0.0) || (NAN(surf->mSpecularValue))) {
    fVar7 = surf->mGlossiness;
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      if (this->mIsLWO2 == true) {
        fVar7 = fVar7 * 10.0 + 2.0;
        m_ = (int)(fVar7 * fVar7);
      }
      else if (fVar7 <= 16.0) {
        m_ = 0x40c00000;
      }
      else if (fVar7 <= 64.0) {
        m_ = 0x41a00000;
      }
      else if (fVar7 <= 256.0) {
        m_ = 0x42480000;
      }
      else {
        m_ = 0x42a00000;
      }
      aiMaterial::AddProperty(pcMat,&surf->mSpecularValue,1,"$mat.shinpercent",0,0);
      aiMaterial::AddProperty(pcMat,(float *)&m_,1,"$mat.shininess",0,0);
      aVar4 = 4.2039e-45;
    }
  }
  _m_ = 0x3f8000003f800000;
  local_5a8 = 1.0;
  lerp<aiColor3D>(&local_5e0,(aiColor3D *)&m_,surf->mColorHighlights);
  aiMaterial::AddProperty(pcMat,&local_5e0,1,"$clr.specular",0,0);
  aiMaterial::AddProperty(pcMat,&surf->mSpecularValue,1,"$mat.shinpercent",0,0);
  local_5e0.b = surf->mLuminosity * 0.8;
  local_5e0.g = local_5e0.b;
  local_5e0.r = local_5e0.b;
  aiMaterial::AddProperty<aiColor3D>(pcMat,&local_5e0,1,"$clr.emissive",0,0);
  if ((surf->mAdditiveTransparency != 0.0) || (NAN(surf->mAdditiveTransparency))) {
    pInput = &surf->mAdditiveTransparency;
    _m_ = CONCAT44(aStack_5ac,1);
  }
  else {
    fVar7 = surf->mTransparency;
    if ((fVar7 == 1e+11) && (!NAN(fVar7))) goto LAB_0040f6bc;
    _m_ = (ulong)(uint)aStack_5ac << 0x20;
    f = 1.0 - fVar7;
    pInput = &f;
  }
  aiMaterial::AddProperty(pcMat,pInput,1,"$mat.opacity",0,0);
  aiMaterial::AddProperty(pcMat,&m_,1,"$mat.blend",0,0);
LAB_0040f6bc:
  bVar3 = HandleTextures(this,pcMat,&surf->mColorTextures,aiTextureType_DIFFUSE);
  if (!bVar3) {
    HandleTextures(this,pcMat,&surf->mDiffuseTextures,aiTextureType_DIFFUSE);
  }
  HandleTextures(this,pcMat,&surf->mSpecularTextures,aiTextureType_SPECULAR);
  HandleTextures(this,pcMat,&surf->mGlossinessTextures,aiTextureType_SHININESS);
  HandleTextures(this,pcMat,&surf->mBumpTextures,aiTextureType_HEIGHT);
  HandleTextures(this,pcMat,&surf->mOpacityTextures,aiTextureType_OPACITY);
  HandleTextures(this,pcMat,&surf->mReflectionTextures,aiTextureType_REFLECTION);
  p_Var6 = (_List_node_base *)&surf->mShaders;
  do {
    p_Var6 = (((_List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_> *)
              &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var6 == (_List_node_base *)&surf->mShaders) {
LAB_0040f861:
      if (surf->mMaximumSmoothAngle <= 0.0) {
        aVar4 = 1.4013e-45;
      }
      m_ = (int)aVar4;
      aiMaterial::AddProperty(pcMat,&m_,1,"$mat.shadingm",0,0);
      fVar7 = surf->mDiffuseValue;
      uVar1 = (surf->mColor).r;
      uVar2 = (surf->mColor).g;
      local_5e0.b = fVar7 * (surf->mColor).b;
      local_5e0.g = fVar7 * (float)uVar2;
      local_5e0.r = fVar7 * (float)uVar1;
      aiMaterial::AddProperty<aiColor3D>(pcMat,&local_5e0,1,"$clr.diffuse",0,0);
      return;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 3);
    bVar3 = std::operator==(__lhs,"LW_SuperCelShader");
    if ((bVar3) || (bVar3 = std::operator==(__lhs,"AH_CelShader"), bVar3)) {
      aVar4 = 7.00649e-45;
      message = "LWO2: Mapping LW_SuperCelShader/AH_CelShader to aiShadingMode_Toon";
LAB_0040f835:
      pLVar5 = DefaultLogger::get();
      Logger::info(pLVar5,message);
      goto LAB_0040f861;
    }
    bVar3 = std::operator==(__lhs,"LW_RealFresnel");
    if ((bVar3) || (bVar3 = std::operator==(__lhs,"LW_FastFresnel"), bVar3)) {
      message = "LWO2: Mapping LW_RealFresnel/LW_FastFresnel to aiShadingMode_Fresnel";
      aVar4 = 1.4013e-44;
      goto LAB_0040f835;
    }
    pLVar5 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[31]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&m_,
               (char (*) [31])"LWO2: Unknown surface shader: ");
    std::operator<<((ostream *)&m_,(string *)__lhs);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar5,(char *)CONCAT44(uStack_5cc,f));
    std::__cxx11::string::~string((string *)&f);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m_);
  } while( true );
}

Assistant:

void LWOImporter::ConvertMaterial(const LWO::Surface& surf,aiMaterial* pcMat)
{
    // copy the name of the surface
    aiString st;
    st.Set(surf.mName);
    pcMat->AddProperty(&st,AI_MATKEY_NAME);

    const int i = surf.bDoubleSided ? 1 : 0;
    pcMat->AddProperty(&i,1,AI_MATKEY_TWOSIDED);

    // add the refraction index and the bump intensity
    pcMat->AddProperty(&surf.mIOR,1,AI_MATKEY_REFRACTI);
    pcMat->AddProperty(&surf.mBumpIntensity,1,AI_MATKEY_BUMPSCALING);

    aiShadingMode m;
    if (surf.mSpecularValue && surf.mGlossiness)
    {
        float fGloss;
        if (mIsLWO2)    {
            fGloss = std::pow( surf.mGlossiness*ai_real( 10.0 )+ ai_real( 2.0 ), ai_real( 2.0 ) );
        }
        else
        {
            if (16.0 >= surf.mGlossiness)
                fGloss = 6.0;
            else if (64.0 >= surf.mGlossiness)
                fGloss = 20.0;
            else if (256.0 >= surf.mGlossiness)
                fGloss = 50.0;
            else fGloss = 80.0;
        }

        pcMat->AddProperty(&surf.mSpecularValue,1,AI_MATKEY_SHININESS_STRENGTH);
        pcMat->AddProperty(&fGloss,1,AI_MATKEY_SHININESS);
        m = aiShadingMode_Phong;
    }
    else m = aiShadingMode_Gouraud;

    // specular color
    aiColor3D clr = lerp( aiColor3D(1.0,1.0,1.0), surf.mColor, surf.mColorHighlights );
    pcMat->AddProperty(&clr,1,AI_MATKEY_COLOR_SPECULAR);
    pcMat->AddProperty(&surf.mSpecularValue,1,AI_MATKEY_SHININESS_STRENGTH);

    // emissive color
    // luminosity is not really the same but it affects the surface in a similar way. Some scaling looks good.
    clr.g = clr.b = clr.r = surf.mLuminosity*ai_real( 0.8 );
    pcMat->AddProperty<aiColor3D>(&clr,1,AI_MATKEY_COLOR_EMISSIVE);

    // opacity ... either additive or default-blended, please
    if (0.0 != surf.mAdditiveTransparency)  {
        const int add = aiBlendMode_Additive;
        pcMat->AddProperty(&surf.mAdditiveTransparency,1,AI_MATKEY_OPACITY);
        pcMat->AddProperty(&add,1,AI_MATKEY_BLEND_FUNC);
    } else if (10e10f != surf.mTransparency)  {
        const int def = aiBlendMode_Default;
        const float f = 1.0f-surf.mTransparency;
        pcMat->AddProperty(&f,1,AI_MATKEY_OPACITY);
        pcMat->AddProperty(&def,1,AI_MATKEY_BLEND_FUNC);
    }


    // ADD TEXTURES to the material
    // TODO: find out how we can handle COLOR textures correctly...
    bool b = HandleTextures(pcMat,surf.mColorTextures,aiTextureType_DIFFUSE);
    b = (b || HandleTextures(pcMat,surf.mDiffuseTextures,aiTextureType_DIFFUSE));
    HandleTextures(pcMat,surf.mSpecularTextures,aiTextureType_SPECULAR);
    HandleTextures(pcMat,surf.mGlossinessTextures,aiTextureType_SHININESS);
    HandleTextures(pcMat,surf.mBumpTextures,aiTextureType_HEIGHT);
    HandleTextures(pcMat,surf.mOpacityTextures,aiTextureType_OPACITY);
    HandleTextures(pcMat,surf.mReflectionTextures,aiTextureType_REFLECTION);

    // Now we need to know which shader to use .. iterate through the shader list of
    // the surface and  search for a name which we know ...
    for (const auto &shader : surf.mShaders)   {
        if (shader.functionName == "LW_SuperCelShader" || shader.functionName == "AH_CelShader")  {
            ASSIMP_LOG_INFO("LWO2: Mapping LW_SuperCelShader/AH_CelShader to aiShadingMode_Toon");

            m = aiShadingMode_Toon;
            break;
        }
        else if (shader.functionName == "LW_RealFresnel" || shader.functionName == "LW_FastFresnel")  {
            ASSIMP_LOG_INFO("LWO2: Mapping LW_RealFresnel/LW_FastFresnel to aiShadingMode_Fresnel");

            m = aiShadingMode_Fresnel;
            break;
        }
        else
        {
            ASSIMP_LOG_WARN_F("LWO2: Unknown surface shader: ", shader.functionName);
        }
    }
    if (surf.mMaximumSmoothAngle <= 0.0)
        m = aiShadingMode_Flat;
    int m_ = static_cast<int>(m);
    pcMat->AddProperty(&m_, 1, AI_MATKEY_SHADING_MODEL);

    // (the diffuse value is just a scaling factor)
    // If a diffuse texture is set, we set this value to 1.0
    clr = (b && false ? aiColor3D(1.0,1.0,1.0) : surf.mColor);
    clr.r *= surf.mDiffuseValue;
    clr.g *= surf.mDiffuseValue;
    clr.b *= surf.mDiffuseValue;
    pcMat->AddProperty<aiColor3D>(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
}